

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilers.cc
# Opt level: O2

void __thiscall
tchecker::details::
rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
::visit(rvalue_expression_compiler_t<std::back_insert_iterator<std::vector<long,_std::allocator<long>_>_>_>
        *this,typed_unary_expression_t *expr)

{
  unary_operator_t uVar1;
  string *this_00;
  allocator<char> local_51;
  string local_50;
  string local_30;
  
  uVar1 = (expr->super_unary_expression_t)._operator;
  if (uVar1 == EXPR_OP_LNOT) {
    if ((expr->super_typed_expression_t)._type == EXPR_TYPE_ATOMIC_PREDICATE) goto LAB_00143ad6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"an unary expression",&local_51);
    invalid_expression(this,&expr->super_typed_expression_t,&local_50);
    this_00 = &local_50;
  }
  else {
    if ((uVar1 != EXPR_OP_NEG) || ((expr->super_typed_expression_t)._type == EXPR_TYPE_INTTERM))
    goto LAB_00143ad6;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"an unary expression",&local_51);
    invalid_expression(this,&expr->super_typed_expression_t,&local_30);
    this_00 = &local_30;
  }
  std::__cxx11::string::~string((string *)this_00);
LAB_00143ad6:
  compile_unary_expression(this,expr);
  return;
}

Assistant:

virtual void visit(tchecker::typed_unary_expression_t const & expr)
  {
    // NEG expresison
    if (expr.unary_operator() == tchecker::EXPR_OP_NEG) {
      if (expr.type() != tchecker::EXPR_TYPE_INTTERM)
        invalid_expression(expr, "an unary expression");
    }
    // LNOT expression
    else if (expr.unary_operator() == tchecker::EXPR_OP_LNOT) {
      if (expr.type() != tchecker::EXPR_TYPE_ATOMIC_PREDICATE)
        invalid_expression(expr, "an unary expression");
    }

    compile_unary_expression(expr);
  }